

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCompOpEval(xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op)

{
  uint uVar1;
  xmlXPathCompExprPtr pxVar2;
  xmlXPathStepOp *pxVar3;
  int *piVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  xmlXPathOp xVar8;
  int iVar9;
  long lVar10;
  xmlXPathObjectPtr obj;
  xmlNodeSetPtr pxVar11;
  xmlChar *pxVar12;
  xmlChar *ns_uri;
  xmlXPathObjectPtr pxVar13;
  xmlXPathFunction p_Var14;
  xmlXPathFunction extraout_RAX;
  long lVar15;
  ulong uVar16;
  xmlXPathContextPtr pxVar17;
  xmlNodePtr first;
  xmlNodePtr local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (ctxt->error != 0) {
    return 0;
  }
  if ((ctxt->context->opLimit != 0) && (iVar6 = xmlXPathCheckOpLimit(ctxt,1), iVar6 < 0)) {
    return 0;
  }
  iVar6 = ctxt->context->depth;
  if (4999 < iVar6) {
    iVar6 = 0x1a;
    goto LAB_001c70dd;
  }
  ctxt->context->depth = iVar6 + 1;
  xVar8 = op->op;
  if (XPATH_OP_SORT < xVar8) {
    iVar6 = 10;
    goto LAB_001c70dd;
  }
  pxVar2 = ctxt->comp;
  switch(xVar8) {
  case XPATH_OP_END:
    break;
  case XPATH_OP_AND:
    xVar8 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    xmlXPathBooleanFunction(ctxt,1);
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->boolval == 0)) break;
    pxVar13 = xmlXPathValuePop(ctxt);
    iVar6 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch2);
    xVar8 = xVar8 + iVar6;
    if (ctxt->error == 0) {
      xmlXPathBooleanFunction(ctxt,1);
      if (ctxt->value != (xmlXPathObjectPtr)0x0) {
        piVar4 = &ctxt->value->boolval;
        *piVar4 = *piVar4 & pxVar13->boolval;
      }
LAB_001c79fa:
      pxVar17 = ctxt->context;
      goto LAB_001c7a01;
    }
    goto LAB_001c7598;
  case XPATH_OP_OR:
    xVar8 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    xmlXPathBooleanFunction(ctxt,1);
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->boolval == 1)) break;
    pxVar13 = xmlXPathValuePop(ctxt);
    iVar6 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch2);
    xVar8 = xVar8 + iVar6;
    if (ctxt->error == 0) {
      xmlXPathBooleanFunction(ctxt,1);
      if (ctxt->value != (xmlXPathObjectPtr)0x0) {
        piVar4 = &ctxt->value->boolval;
        *piVar4 = *piVar4 | pxVar13->boolval;
      }
      goto LAB_001c79fa;
    }
LAB_001c7598:
    xmlXPathFreeObject(pxVar13);
    break;
  case XPATH_OP_EQUAL:
    iVar9 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    iVar7 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch2);
    if (ctxt->error != 0) {
      return 0;
    }
    if (op->value == 0) {
      iVar6 = xmlXPathNotEqualValues(ctxt);
    }
    else {
      iVar6 = xmlXPathEqualValues(ctxt);
    }
    xVar8 = iVar7 + iVar9;
    goto LAB_001c7a13;
  case XPATH_OP_CMP:
    iVar6 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    iVar9 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch2);
    if (ctxt->error != 0) {
      return 0;
    }
    xVar8 = iVar9 + iVar6;
    iVar6 = xmlXPathCompareValues(ctxt,op->value,op->value2);
LAB_001c7a13:
    pxVar13 = xmlXPathCacheNewBoolean(ctxt,iVar6);
    goto LAB_001c7a1d;
  case XPATH_OP_PLUS:
    xVar8 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    if ((long)op->ch2 != -1) {
      iVar6 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch2);
      xVar8 = iVar6 + xVar8;
    }
    if (ctxt->error != 0) {
      return 0;
    }
    switch(op->value) {
    case 0:
      xmlXPathSubValues(ctxt);
      break;
    case 1:
      xmlXPathAddValues(ctxt);
      break;
    case 2:
      xmlXPathValueFlipSign(ctxt);
      break;
    case 3:
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_NUMBER)) {
        xmlXPathNumberFunction(ctxt,1);
      }
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_NUMBER)) break;
      goto LAB_001c79cf;
    }
    break;
  case XPATH_OP_MULT:
    iVar6 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    iVar9 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch2);
    if (ctxt->error != 0) {
      return 0;
    }
    xVar8 = iVar9 + iVar6;
    iVar6 = op->value;
    if (iVar6 == 2) {
      xmlXPathModValues(ctxt);
    }
    else if (iVar6 == 1) {
      xmlXPathDivValues(ctxt);
    }
    else if (iVar6 == 0) {
      xmlXPathMultValues(ctxt);
    }
    break;
  case XPATH_OP_UNION:
    iVar6 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
    if (ctxt->error != 0) {
      return 0;
    }
    iVar9 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch2);
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar13 = xmlXPathValuePop(ctxt);
    obj = xmlXPathValuePop(ctxt);
    if (((obj != (xmlXPathObjectPtr)0x0) &&
        (pxVar13 != (xmlXPathObjectPtr)0x0 && obj->type == XPATH_NODESET)) &&
       (pxVar13->type == XPATH_NODESET)) {
      xVar8 = iVar9 + iVar6;
      if ((ctxt->context->opLimit == 0) ||
         (((obj->nodesetval == (xmlNodeSetPtr)0x0 ||
           (iVar6 = xmlXPathCheckOpLimit(ctxt,(long)obj->nodesetval->nodeNr), -1 < iVar6)) &&
          ((pxVar13->nodesetval == (xmlNodeSetPtr)0x0 ||
           (iVar6 = xmlXPathCheckOpLimit(ctxt,(long)pxVar13->nodesetval->nodeNr), -1 < iVar6)))))) {
        pxVar11 = pxVar13->nodesetval;
        if ((pxVar11 != (xmlNodeSetPtr)0x0) && (pxVar11->nodeNr != 0)) {
          pxVar11 = xmlXPathNodeSetMerge(obj->nodesetval,pxVar11);
          obj->nodesetval = pxVar11;
          if (pxVar11 == (xmlNodeSetPtr)0x0) {
            xmlXPathPErrMemory(ctxt);
          }
        }
        xmlXPathValuePush(ctxt,obj);
      }
      else {
        xmlXPathReleaseObject(ctxt->context,obj);
      }
      pxVar17 = ctxt->context;
LAB_001c7a01:
      xmlXPathReleaseObject(pxVar17,pxVar13);
      break;
    }
    xmlXPathReleaseObject(ctxt->context,obj);
    xmlXPathReleaseObject(ctxt->context,pxVar13);
LAB_001c79cf:
    iVar6 = 0xb;
LAB_001c70dd:
    xmlXPathErr(ctxt,iVar6);
    return 0;
  case XPATH_OP_ROOT:
    xmlXPathRoot(ctxt);
    goto LAB_001c7778;
  case XPATH_OP_NODE:
    xVar8 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar8 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    if ((long)op->ch2 != -1) {
      iVar6 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch2);
      xVar8 = iVar6 + xVar8;
    }
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar13 = xmlXPathCacheNewNodeSet(ctxt,ctxt->context->node);
    goto LAB_001c7a1d;
  case XPATH_OP_COLLECT:
    if ((long)op->ch1 != -1) {
      iVar6 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
      if (ctxt->error != 0) {
        return 0;
      }
      iVar9 = xmlXPathNodeCollectAndTest(ctxt,op,(xmlNodePtr *)0x0,(xmlNodePtr *)0x0,0);
      xVar8 = iVar9 + iVar6;
      break;
    }
    goto LAB_001c7778;
  case XPATH_OP_VALUE:
    pxVar13 = xmlXPathCacheObjectCopy(ctxt,(xmlXPathObjectPtr)op->value4);
    xmlXPathValuePush(ctxt,pxVar13);
LAB_001c7778:
    xVar8 = XPATH_OP_END;
    break;
  case XPATH_OP_VARIABLE:
    if ((long)op->ch1 == -1) {
      xVar8 = XPATH_OP_END;
    }
    else {
      xVar8 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
    }
    if ((xmlChar *)op->value5 == (xmlChar *)0x0) {
      pxVar13 = xmlXPathVariableLookup(ctxt->context,(xmlChar *)op->value4);
    }
    else {
      pxVar12 = xmlXPathNsLookup(ctxt->context,(xmlChar *)op->value5);
      if (pxVar12 == (xmlChar *)0x0) {
        iVar6 = 0x13;
        goto LAB_001c78a1;
      }
      pxVar13 = xmlXPathVariableLookupNS(ctxt->context,(xmlChar *)op->value4,pxVar12);
    }
    if (pxVar13 == (xmlXPathObjectPtr)0x0) {
      iVar6 = 5;
LAB_001c78a1:
      xmlXPathErr(ctxt,iVar6);
      return 0;
    }
LAB_001c7a1d:
    xmlXPathValuePush(ctxt,pxVar13);
    break;
  case XPATH_OP_FUNCTION:
    iVar6 = ctxt->valueNr;
    if ((long)op->ch1 == -1) {
      xVar8 = XPATH_OP_END;
LAB_001c7815:
      iVar9 = ctxt->valueNr;
      uVar1 = op->value;
      uVar16 = (ulong)uVar1;
      iVar7 = 10;
      if (iVar9 < (int)(uVar1 + iVar6)) {
LAB_001c7828:
        xmlXPathErr(ctxt,iVar7);
      }
      else {
        if (0 < (int)uVar1) {
          do {
            iVar9 = iVar9 + -1;
            if (ctxt->valueTab[iVar9] == (xmlXPathObjectPtr)0x0) goto LAB_001c7828;
            uVar16 = uVar16 - 1;
          } while (uVar16 != 0);
        }
        p_Var14 = op->cache;
        if (p_Var14 != (xmlXPathFunction)0x0) {
LAB_001c7ae4:
          pxVar17 = ctxt->context;
          local_48 = *(undefined4 *)&pxVar17->function;
          uStack_44 = *(undefined4 *)((long)&pxVar17->function + 4);
          uStack_40 = *(undefined4 *)&pxVar17->functionURI;
          uStack_3c = *(undefined4 *)((long)&pxVar17->functionURI + 4);
          pxVar17->function = (xmlChar *)op->value4;
          pxVar17->functionURI = (xmlChar *)op->cacheURI;
          (*p_Var14)(ctxt,op->value);
          pxVar17 = ctxt->context;
          pxVar17->function = (xmlChar *)CONCAT44(uStack_44,local_48);
          pxVar17->functionURI = (xmlChar *)CONCAT44(uStack_3c,uStack_40);
          bVar5 = true;
          if ((ctxt->error != 0) || (iVar7 = 0x17, ctxt->valueNr == iVar6 + 1)) goto LAB_001c7832;
          goto LAB_001c7828;
        }
        pxVar17 = ctxt->context;
        if ((xmlChar *)op->value5 == (xmlChar *)0x0) {
          pxVar12 = (xmlChar *)op->value4;
          ns_uri = (xmlChar *)0x0;
LAB_001c7a57:
          p_Var14 = xmlXPathFunctionLookupNS(pxVar17,pxVar12,ns_uri);
          if (p_Var14 == (xmlXPathFunction)0x0) {
            xmlXPathErr(ctxt,9);
            p_Var14 = (xmlXPathFunction)0x0;
            bVar5 = false;
          }
          else {
            op->cache = p_Var14;
            op->cacheURI = ns_uri;
            bVar5 = true;
          }
        }
        else {
          ns_uri = xmlXPathNsLookup(pxVar17,(xmlChar *)op->value5);
          if (ns_uri != (xmlChar *)0x0) {
            pxVar17 = ctxt->context;
            pxVar12 = (xmlChar *)op->value4;
            goto LAB_001c7a57;
          }
          xmlXPathErr(ctxt,0x13);
          bVar5 = false;
          p_Var14 = extraout_RAX;
        }
        if (bVar5) goto LAB_001c7ae4;
      }
      bVar5 = false;
    }
    else {
      xVar8 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
      bVar5 = true;
      if (ctxt->error == 0) goto LAB_001c7815;
    }
LAB_001c7832:
    if (!bVar5) {
      return 0;
    }
    break;
  case XPATH_OP_ARG:
    if ((long)op->ch1 == -1) {
      xVar8 = XPATH_OP_END;
    }
    else {
      xVar8 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
      if (ctxt->error != 0) {
        return 0;
      }
    }
    if ((long)op->ch2 != -1) {
      iVar6 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch2);
      if (ctxt->error != 0) {
        return 0;
      }
      xVar8 = iVar6 + xVar8;
    }
    break;
  default:
    lVar10 = (long)op->ch1;
    xVar8 = XPATH_OP_END;
    if (((lVar10 == -1) || (lVar15 = (long)op->ch2, lVar15 == -1)) ||
       ((pxVar3 = pxVar2->steps, (pxVar3[lVar10].op & ~XPATH_OP_AND) != XPATH_OP_FILTER ||
        (xVar8 = XPATH_OP_END, pxVar3[lVar15].op != XPATH_OP_VALUE)))) {
LAB_001c78b6:
      if ((((long)op->ch1 != -1) && (lVar10 = (long)op->ch2, lVar10 != -1)) &&
         ((pxVar3 = pxVar2->steps, pxVar3[op->ch1].op == XPATH_OP_SORT &&
          (pxVar3[lVar10].op == XPATH_OP_SORT)))) {
        lVar10 = (long)pxVar3[lVar10].ch1;
        iVar9 = 0;
        iVar6 = 0;
        if (((lVar10 != -1) && (pxVar3[lVar10].op == XPATH_OP_FUNCTION)) &&
           ((iVar6 = iVar9, pxVar3[lVar10].value5 == (void *)0x0 &&
            (((pxVar3[lVar10].value == 0 && ((xmlChar *)pxVar3[lVar10].value4 != (xmlChar *)0x0)) &&
             (iVar9 = xmlStrEqual((xmlChar *)pxVar3[lVar10].value4,(xmlChar *)"last"), iVar9 != 0)))
            ))) {
          local_50 = (xmlNodePtr)0x0;
          iVar9 = xmlXPathCompOpEvalLast(ctxt,pxVar2->steps + op->ch1,&local_50);
          iVar6 = 1;
          if (ctxt->error == 0) {
            pxVar13 = ctxt->value;
            iVar6 = 2;
            if (((pxVar13 != (xmlXPathObjectPtr)0x0) && (pxVar13->type == XPATH_NODESET)) &&
               ((pxVar11 = pxVar13->nodesetval, pxVar11 != (xmlNodeSetPtr)0x0 &&
                ((pxVar11->nodeTab != (xmlNodePtr *)0x0 && (1 < pxVar11->nodeNr)))))) {
              xmlXPathNodeSetKeepLast(pxVar11);
            }
          }
          xVar8 = xVar8 + iVar9;
        }
        if (iVar6 != 0) goto LAB_001c793e;
      }
      if ((long)op->ch1 != -1) {
        iVar6 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
        xVar8 = iVar6 + xVar8;
      }
      iVar6 = 1;
      if (((ctxt->error == 0) && (iVar6 = 2, op->ch2 != -1)) &&
         (ctxt->value != (xmlXPathObjectPtr)0x0)) {
        if (ctxt->value->type == XPATH_NODESET) {
          pxVar13 = xmlXPathValuePop(ctxt);
          pxVar11 = pxVar13->nodesetval;
          if (pxVar11 != (xmlNodeSetPtr)0x0) {
            xmlXPathNodeSetFilter(ctxt,pxVar11,op->ch2,1,pxVar11->nodeNr,1);
          }
          xmlXPathValuePush(ctxt,pxVar13);
        }
        else {
          xmlXPathErr(ctxt,0xb);
          iVar6 = 1;
        }
      }
    }
    else {
      piVar4 = (int *)pxVar3[lVar15].value4;
      if ((piVar4 == (int *)0x0) || (*piVar4 != 3)) {
        xVar8 = XPATH_OP_END;
        iVar6 = 0;
      }
      else {
        xVar8 = XPATH_OP_END;
        iVar6 = 0;
        if ((*(double *)(piVar4 + 6) == 1.0) && (iVar6 = 0, !NAN(*(double *)(piVar4 + 6)))) {
          local_50 = (xmlNodePtr)0x0;
          xVar8 = xmlXPathCompOpEvalFirst(ctxt,pxVar3 + lVar10,&local_50);
          iVar6 = 1;
          if (ctxt->error == 0) {
            pxVar13 = ctxt->value;
            iVar6 = 2;
            if ((((pxVar13 != (xmlXPathObjectPtr)0x0) && (pxVar13->type == XPATH_NODESET)) &&
                (pxVar11 = pxVar13->nodesetval, pxVar11 != (xmlNodeSetPtr)0x0)) &&
               (1 < pxVar11->nodeNr)) {
              xmlXPathNodeSetClearFromPos(pxVar11,1,1);
            }
          }
        }
      }
      if (iVar6 == 0) goto LAB_001c78b6;
    }
LAB_001c793e:
    if (iVar6 != 2) {
      return 0;
    }
    break;
  case XPATH_OP_SORT:
    xVar8 = XPATH_OP_END;
    if ((long)op->ch1 != -1) {
      xVar8 = xmlXPathCompOpEval(ctxt,pxVar2->steps + op->ch1);
    }
    if (ctxt->error != 0) {
      return 0;
    }
    pxVar13 = ctxt->value;
    if ((((pxVar13 != (xmlXPathObjectPtr)0x0) && (pxVar13->type == XPATH_NODESET)) &&
        (pxVar11 = pxVar13->nodesetval, pxVar11 != (xmlNodeSetPtr)0x0)) &&
       (1 < (long)pxVar11->nodeNr)) {
      libxml_domnode_tim_sort(pxVar11->nodeTab,(long)pxVar11->nodeNr);
    }
  }
  piVar4 = &ctxt->context->depth;
  *piVar4 = *piVar4 + -1;
  return xVar8;
}

Assistant:

static int
xmlXPathCompOpEval(xmlXPathParserContextPtr ctxt, xmlXPathStepOpPtr op)
{
    int total = 0;
    int equal, ret;
    xmlXPathCompExprPtr comp;
    xmlXPathObjectPtr arg1, arg2;

    CHECK_ERROR0;
    if (OP_LIMIT_EXCEEDED(ctxt, 1))
        return(0);
    if (ctxt->context->depth >= XPATH_MAX_RECURSION_DEPTH)
        XP_ERROR0(XPATH_RECURSION_LIMIT_EXCEEDED);
    ctxt->context->depth += 1;
    comp = ctxt->comp;
    switch (op->op) {
        case XPATH_OP_END:
            break;
        case XPATH_OP_AND:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            xmlXPathBooleanFunction(ctxt, 1);
            if ((ctxt->value == NULL) || (ctxt->value->boolval == 0))
                break;
            arg2 = xmlXPathValuePop(ctxt);
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    if (ctxt->error) {
		xmlXPathFreeObject(arg2);
		break;
	    }
            xmlXPathBooleanFunction(ctxt, 1);
            if (ctxt->value != NULL)
                ctxt->value->boolval &= arg2->boolval;
	    xmlXPathReleaseObject(ctxt->context, arg2);
            break;
        case XPATH_OP_OR:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            xmlXPathBooleanFunction(ctxt, 1);
            if ((ctxt->value == NULL) || (ctxt->value->boolval == 1))
                break;
            arg2 = xmlXPathValuePop(ctxt);
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    if (ctxt->error) {
		xmlXPathFreeObject(arg2);
		break;
	    }
            xmlXPathBooleanFunction(ctxt, 1);
            if (ctxt->value != NULL)
                ctxt->value->boolval |= arg2->boolval;
	    xmlXPathReleaseObject(ctxt->context, arg2);
            break;
        case XPATH_OP_EQUAL:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
	    if (op->value)
		equal = xmlXPathEqualValues(ctxt);
	    else
		equal = xmlXPathNotEqualValues(ctxt);
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, equal));
            break;
        case XPATH_OP_CMP:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
            ret = xmlXPathCompareValues(ctxt, op->value, op->value2);
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, ret));
            break;
        case XPATH_OP_PLUS:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if (op->ch2 != -1) {
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    }
	    CHECK_ERROR0;
            if (op->value == 0)
                xmlXPathSubValues(ctxt);
            else if (op->value == 1)
                xmlXPathAddValues(ctxt);
            else if (op->value == 2)
                xmlXPathValueFlipSign(ctxt);
            else if (op->value == 3) {
                CAST_TO_NUMBER;
                CHECK_TYPE0(XPATH_NUMBER);
            }
            break;
        case XPATH_OP_MULT:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
            if (op->value == 0)
                xmlXPathMultValues(ctxt);
            else if (op->value == 1)
                xmlXPathDivValues(ctxt);
            else if (op->value == 2)
                xmlXPathModValues(ctxt);
            break;
        case XPATH_OP_UNION:
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;

            arg2 = xmlXPathValuePop(ctxt);
            arg1 = xmlXPathValuePop(ctxt);
            if ((arg1 == NULL) || (arg1->type != XPATH_NODESET) ||
                (arg2 == NULL) || (arg2->type != XPATH_NODESET)) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                XP_ERROR0(XPATH_INVALID_TYPE);
            }
            if ((ctxt->context->opLimit != 0) &&
                (((arg1->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg1->nodesetval->nodeNr) < 0)) ||
                 ((arg2->nodesetval != NULL) &&
                  (xmlXPathCheckOpLimit(ctxt,
                                        arg2->nodesetval->nodeNr) < 0)))) {
	        xmlXPathReleaseObject(ctxt->context, arg1);
	        xmlXPathReleaseObject(ctxt->context, arg2);
                break;
            }

	    if (((arg2->nodesetval != NULL) &&
		 (arg2->nodesetval->nodeNr != 0)))
	    {
		arg1->nodesetval = xmlXPathNodeSetMerge(arg1->nodesetval,
							arg2->nodesetval);
                if (arg1->nodesetval == NULL)
                    xmlXPathPErrMemory(ctxt);
	    }

            xmlXPathValuePush(ctxt, arg1);
	    xmlXPathReleaseObject(ctxt->context, arg2);
            break;
        case XPATH_OP_ROOT:
            xmlXPathRoot(ctxt);
            break;
        case XPATH_OP_NODE:
            if (op->ch1 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if (op->ch2 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	    CHECK_ERROR0;
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt,
                                                    ctxt->context->node));
            break;
        case XPATH_OP_COLLECT:{
                if (op->ch1 == -1)
                    break;

                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
		CHECK_ERROR0;

                total += xmlXPathNodeCollectAndTest(ctxt, op, NULL, NULL, 0);
                break;
            }
        case XPATH_OP_VALUE:
            xmlXPathValuePush(ctxt, xmlXPathCacheObjectCopy(ctxt, op->value4));
            break;
        case XPATH_OP_VARIABLE:{
		xmlXPathObjectPtr val;

                if (op->ch1 != -1)
                    total +=
                        xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
                if (op->value5 == NULL) {
		    val = xmlXPathVariableLookup(ctxt->context, op->value4);
		    if (val == NULL)
			XP_ERROR0(XPATH_UNDEF_VARIABLE_ERROR);
                    xmlXPathValuePush(ctxt, val);
		} else {
                    const xmlChar *URI;

                    URI = xmlXPathNsLookup(ctxt->context, op->value5);
                    if (URI == NULL) {
                        XP_ERROR0(XPATH_UNDEF_PREFIX_ERROR);
                        break;
                    }
		    val = xmlXPathVariableLookupNS(ctxt->context,
                                                       op->value4, URI);
		    if (val == NULL)
			XP_ERROR0(XPATH_UNDEF_VARIABLE_ERROR);
                    xmlXPathValuePush(ctxt, val);
                }
                break;
            }
        case XPATH_OP_FUNCTION:{
                xmlXPathFunction func;
                const xmlChar *oldFunc, *oldFuncURI;
		int i;
                int frame;

                frame = ctxt->valueNr;
                if (op->ch1 != -1) {
                    total +=
                        xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
                    if (ctxt->error != XPATH_EXPRESSION_OK)
                        break;
                }
		if (ctxt->valueNr < frame + op->value)
		    XP_ERROR0(XPATH_INVALID_OPERAND);
		for (i = 0; i < op->value; i++) {
		    if (ctxt->valueTab[(ctxt->valueNr - 1) - i] == NULL)
			XP_ERROR0(XPATH_INVALID_OPERAND);
                }
                if (op->cache != NULL)
                    func = op->cache;
                else {
                    const xmlChar *URI = NULL;

                    if (op->value5 == NULL)
                        func =
                            xmlXPathFunctionLookup(ctxt->context,
                                                   op->value4);
                    else {
                        URI = xmlXPathNsLookup(ctxt->context, op->value5);
                        if (URI == NULL)
                            XP_ERROR0(XPATH_UNDEF_PREFIX_ERROR);
                        func = xmlXPathFunctionLookupNS(ctxt->context,
                                                        op->value4, URI);
                    }
                    if (func == NULL)
                        XP_ERROR0(XPATH_UNKNOWN_FUNC_ERROR);
                    op->cache = func;
                    op->cacheURI = (void *) URI;
                }
                oldFunc = ctxt->context->function;
                oldFuncURI = ctxt->context->functionURI;
                ctxt->context->function = op->value4;
                ctxt->context->functionURI = op->cacheURI;
                func(ctxt, op->value);
                ctxt->context->function = oldFunc;
                ctxt->context->functionURI = oldFuncURI;
                if ((ctxt->error == XPATH_EXPRESSION_OK) &&
                    (ctxt->valueNr != frame + 1))
                    XP_ERROR0(XPATH_STACK_ERROR);
                break;
            }
        case XPATH_OP_ARG:
            if (op->ch1 != -1) {
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	        CHECK_ERROR0;
            }
            if (op->ch2 != -1) {
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch2]);
	        CHECK_ERROR0;
	    }
            break;
        case XPATH_OP_PREDICATE:
        case XPATH_OP_FILTER:{
                xmlXPathObjectPtr obj;
                xmlNodeSetPtr set;

                /*
                 * Optimization for ()[1] selection i.e. the first elem
                 */
                if ((op->ch1 != -1) && (op->ch2 != -1) &&
#ifdef XP_OPTIMIZED_FILTER_FIRST
		    /*
		    * FILTER TODO: Can we assume that the inner processing
		    *  will result in an ordered list if we have an
		    *  XPATH_OP_FILTER?
		    *  What about an additional field or flag on
		    *  xmlXPathObject like @sorted ? This way we wouldn't need
		    *  to assume anything, so it would be more robust and
		    *  easier to optimize.
		    */
                    ((comp->steps[op->ch1].op == XPATH_OP_SORT) || /* 18 */
		     (comp->steps[op->ch1].op == XPATH_OP_FILTER)) && /* 17 */
#else
		    (comp->steps[op->ch1].op == XPATH_OP_SORT) &&
#endif
                    (comp->steps[op->ch2].op == XPATH_OP_VALUE)) { /* 12 */
                    xmlXPathObjectPtr val;

                    val = comp->steps[op->ch2].value4;
                    if ((val != NULL) && (val->type == XPATH_NUMBER) &&
                        (val->floatval == 1.0)) {
                        xmlNodePtr first = NULL;

                        total +=
                            xmlXPathCompOpEvalFirst(ctxt,
                                                    &comp->steps[op->ch1],
                                                    &first);
			CHECK_ERROR0;
                        /*
                         * The nodeset should be in document order,
                         * Keep only the first value
                         */
                        if ((ctxt->value != NULL) &&
                            (ctxt->value->type == XPATH_NODESET) &&
                            (ctxt->value->nodesetval != NULL) &&
                            (ctxt->value->nodesetval->nodeNr > 1))
                            xmlXPathNodeSetClearFromPos(ctxt->value->nodesetval,
                                                        1, 1);
                        break;
                    }
                }
                /*
                 * Optimization for ()[last()] selection i.e. the last elem
                 */
                if ((op->ch1 != -1) && (op->ch2 != -1) &&
                    (comp->steps[op->ch1].op == XPATH_OP_SORT) &&
                    (comp->steps[op->ch2].op == XPATH_OP_SORT)) {
                    int f = comp->steps[op->ch2].ch1;

                    if ((f != -1) &&
                        (comp->steps[f].op == XPATH_OP_FUNCTION) &&
                        (comp->steps[f].value5 == NULL) &&
                        (comp->steps[f].value == 0) &&
                        (comp->steps[f].value4 != NULL) &&
                        (xmlStrEqual
                         (comp->steps[f].value4, BAD_CAST "last"))) {
                        xmlNodePtr last = NULL;

                        total +=
                            xmlXPathCompOpEvalLast(ctxt,
                                                   &comp->steps[op->ch1],
                                                   &last);
			CHECK_ERROR0;
                        /*
                         * The nodeset should be in document order,
                         * Keep only the last value
                         */
                        if ((ctxt->value != NULL) &&
                            (ctxt->value->type == XPATH_NODESET) &&
                            (ctxt->value->nodesetval != NULL) &&
                            (ctxt->value->nodesetval->nodeTab != NULL) &&
                            (ctxt->value->nodesetval->nodeNr > 1))
                            xmlXPathNodeSetKeepLast(ctxt->value->nodesetval);
                        break;
                    }
                }
		/*
		* Process inner predicates first.
		* Example "index[parent::book][1]":
		* ...
		*   PREDICATE   <-- we are here "[1]"
		*     PREDICATE <-- process "[parent::book]" first
		*       SORT
		*         COLLECT  'parent' 'name' 'node' book
		*           NODE
		*     ELEM Object is a number : 1
		*/
                if (op->ch1 != -1)
                    total +=
                        xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
		CHECK_ERROR0;
                if (op->ch2 == -1)
                    break;
                if (ctxt->value == NULL)
                    break;

                /*
                 * In case of errors, xmlXPathNodeSetFilter can pop additional
                 * nodes from the stack. We have to temporarily remove the
                 * nodeset object from the stack to avoid freeing it
                 * prematurely.
                 */
                CHECK_TYPE0(XPATH_NODESET);
                obj = xmlXPathValuePop(ctxt);
                set = obj->nodesetval;
                if (set != NULL)
                    xmlXPathNodeSetFilter(ctxt, set, op->ch2,
                                          1, set->nodeNr, 1);
                xmlXPathValuePush(ctxt, obj);
                break;
            }
        case XPATH_OP_SORT:
            if (op->ch1 != -1)
                total += xmlXPathCompOpEval(ctxt, &comp->steps[op->ch1]);
	    CHECK_ERROR0;
            if ((ctxt->value != NULL) &&
                (ctxt->value->type == XPATH_NODESET) &&
                (ctxt->value->nodesetval != NULL) &&
		(ctxt->value->nodesetval->nodeNr > 1))
	    {
                xmlXPathNodeSetSort(ctxt->value->nodesetval);
	    }
            break;
        default:
            XP_ERROR0(XPATH_INVALID_OPERAND);
            break;
    }

    ctxt->context->depth -= 1;
    return (total);
}